

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O2

LineStream * __thiscall deqp::gls::LineStream::operator<<(LineStream *this,char *line)

{
  ostream *poVar1;
  int i;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < this->m_indent; iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)&this->m_stream,"\t");
  }
  poVar1 = std::operator<<((ostream *)&this->m_stream,line);
  std::operator<<(poVar1,"\n");
  return this;
}

Assistant:

LineStream&			operator<<		(const char* line)	{ for (int i = 0; i < m_indent; i++) { m_stream << "\t"; } m_stream << line << "\n"; return *this; }